

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O1

void deqp::gles2::Functional::checkEitherError
               (TestContext *testCtx,Context *ctx,GLenum expectA,GLenum expectB)

{
  ostringstream *this;
  uint uVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  uVar1 = (*ctx->_vptr_Context[0x79])(ctx,ctx,CONCAT44(in_register_00000014,expectA));
  local_1a0._0_8_ = testCtx->m_log;
  this = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ",3);
  pcVar2 = "Fail";
  if ((uVar1 & 0xfffffffd) == 0x500) {
    pcVar2 = "Pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar2,4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", expected ",0xb);
  local_1b0.m_getName = glu::getErrorName;
  local_1b0.m_value = 0x500;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," or ",4);
  local_1c0.m_getName = glu::getErrorName;
  local_1c0.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  if ((uVar1 & 0xfffffffd) != 0x500) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Error code mismatch");
  }
  return;
}

Assistant:

static void checkEitherError (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum expectA, GLenum expectB)
{
	GLenum	result	= ctx.getError();
	bool	isOk	= (result == expectA || result == expectB);

	testCtx.getLog() << TestLog::Message << "// " << (isOk ? "Pass" : "Fail") << ", expected " << glu::getErrorStr(expectA) << " or " << glu::getErrorStr(expectB) << TestLog::EndMessage;

	if (!isOk)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error code mismatch");
}